

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

Transform * __thiscall
iDynTree::KinDynComputations::getCentroidalAverageVelocity(KinDynComputations *this)

{
  Rotation *pRVar1;
  long in_RSI;
  Transform *in_RDI;
  Rotation *A_R_B;
  Transform newOutputFrame_X_oldOutputFrame;
  Position vectorFromComToBaseWithRotationOfBase;
  Twist base_averageVelocity;
  SpatialMomentum base_momentum;
  SpatialInertia *base_lockedInertia;
  KinDynComputationsPrivateAttributes *in_stack_fffffffffffffd10;
  KinDynComputations *in_stack_fffffffffffffd20;
  Rotation local_2a8 [24];
  Transform local_290 [96];
  Position *local_230;
  Rotation local_228 [72];
  Transform local_1e0 [96];
  Transform local_180 [120];
  Position local_108 [40];
  undefined1 local_e0 [144];
  Transform local_50 [56];
  SpatialInertia *local_18;
  
  computeRawMassMatrixAndTotalMomentum(in_stack_fffffffffffffd20);
  local_18 = KinDynComputationsPrivateAttributes::getRobotLockedInertia(in_stack_fffffffffffffd10);
  iDynTree::FreeFloatingPos::worldBasePos();
  iDynTree::Transform::inverse();
  iDynTree::Transform::operator*(local_50,(SpatialMomentum *)(local_e0 + 0x30));
  iDynTree::SpatialInertia::applyInverse((SpatialMomentum *)local_e0);
  KinDynComputationsPrivateAttributes::getRobotLockedInertia(in_stack_fffffffffffffd10);
  iDynTree::SpatialInertia::getCenterOfMass();
  iDynTree::Position::inverse(local_108);
  iDynTree::Transform::Transform(local_180);
  if (*(int *)(*(long *)(in_RSI + 8) + 4) == 1) {
    iDynTree::Rotation::Identity();
    iDynTree::Transform::Transform(local_1e0,local_228,local_108);
    iDynTree::Transform::operator=(local_180,local_1e0);
  }
  else {
    iDynTree::FreeFloatingPos::worldBasePos();
    local_230 = (Position *)iDynTree::Transform::getRotation();
    iDynTree::FreeFloatingPos::worldBasePos();
    pRVar1 = (Rotation *)iDynTree::Transform::getRotation();
    iDynTree::Rotation::operator*(local_2a8,local_230);
    iDynTree::Transform::Transform(local_290,pRVar1,(Position *)local_2a8);
    iDynTree::Transform::operator=(local_180,local_290);
  }
  iDynTree::Transform::operator*(in_RDI,(Twist *)local_180);
  SpatialMomentum::~SpatialMomentum((SpatialMomentum *)0x1ceaf0);
  return in_RDI;
}

Assistant:

Twist KinDynComputations::getCentroidalAverageVelocity()
{
    this->computeRawMassMatrixAndTotalMomentum();

    const SpatialInertia & base_lockedInertia = pimpl->getRobotLockedInertia();
    SpatialMomentum base_momentum = pimpl->m_pos.worldBasePos().inverse()*pimpl->m_totalMomentum;
    Twist           base_averageVelocity = base_lockedInertia.applyInverse(base_momentum);

    // Get the center of mass in the base frame
    Position vectorFromComToBaseWithRotationOfBase = Position::inverse(pimpl->getRobotLockedInertia().getCenterOfMass());

    Transform newOutputFrame_X_oldOutputFrame;
    if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        // oldOutputFrame is B
        // newOutputFrame is G[B]

        newOutputFrame_X_oldOutputFrame =  Transform(Rotation::Identity(),vectorFromComToBaseWithRotationOfBase);
    }
    else
    {
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION ||
               pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        // oldOutputFrame is B
        // newOutputFrame is G[A]
        const Rotation & A_R_B = pimpl->m_pos.worldBasePos().getRotation();
        newOutputFrame_X_oldOutputFrame = Transform(pimpl->m_pos.worldBasePos().getRotation(),A_R_B*(vectorFromComToBaseWithRotationOfBase));
    }

    return newOutputFrame_X_oldOutputFrame*base_averageVelocity;
}